

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satMem.c
# Opt level: O1

Sat_MmFixed_t * Sat_MmFixedStart(int nEntrySize)

{
  uint uVar1;
  Sat_MmFixed_t *pSVar2;
  char **ppcVar3;
  
  pSVar2 = (Sat_MmFixed_t *)malloc(0x38);
  pSVar2->nEntrySize = 0;
  pSVar2->nEntriesAlloc = 0;
  pSVar2->nEntriesUsed = 0;
  pSVar2->nEntriesMax = 0;
  pSVar2->pEntriesFree = (char *)0x0;
  pSVar2->nChunkSize = 0;
  pSVar2->nChunksAlloc = 0;
  *(undefined8 *)&pSVar2->nChunks = 0;
  pSVar2->pChunks = (char **)0x0;
  pSVar2->nMemoryUsed = 0;
  pSVar2->nMemoryAlloc = 0;
  pSVar2->nEntrySize = nEntrySize;
  pSVar2->nEntriesAlloc = 0;
  pSVar2->nEntriesUsed = 0;
  pSVar2->pEntriesFree = (char *)0x0;
  uVar1 = 0x400;
  if (0x3f < nEntrySize) {
    uVar1 = 0x10000 / (uint)nEntrySize;
  }
  pSVar2->nChunkSize = uVar1;
  if (uVar1 < 8) {
    pSVar2->nChunkSize = 8;
  }
  pSVar2->nChunksAlloc = 0x40;
  pSVar2->nChunks = 0;
  ppcVar3 = (char **)malloc(0x200);
  pSVar2->pChunks = ppcVar3;
  pSVar2->nMemoryUsed = 0;
  pSVar2->nMemoryAlloc = 0;
  return pSVar2;
}

Assistant:

Sat_MmFixed_t * Sat_MmFixedStart( int nEntrySize )
{
    Sat_MmFixed_t * p;

    p = ABC_ALLOC( Sat_MmFixed_t, 1 );
    memset( p, 0, sizeof(Sat_MmFixed_t) );

    p->nEntrySize    = nEntrySize;
    p->nEntriesAlloc = 0;
    p->nEntriesUsed  = 0;
    p->pEntriesFree  = NULL;

    if ( nEntrySize * (1 << 10) < (1<<16) )
        p->nChunkSize = (1 << 10);
    else
        p->nChunkSize = (1<<16) / nEntrySize;
    if ( p->nChunkSize < 8 )
        p->nChunkSize = 8;

    p->nChunksAlloc  = 64;
    p->nChunks       = 0;
    p->pChunks       = ABC_ALLOC( char *, p->nChunksAlloc );

    p->nMemoryUsed   = 0;
    p->nMemoryAlloc  = 0;
    return p;
}